

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O2

void R_DrawAddClampTranslatedColumnP_C(void)

{
  lighttable_t *plVar1;
  fixed_t fVar2;
  DWORD *pDVar3;
  DWORD *pDVar4;
  BYTE *pBVar5;
  BYTE *pBVar6;
  int iVar7;
  byte *pbVar8;
  fixed_t fVar9;
  long lVar10;
  uint uVar11;
  
  pBVar6 = dc_translation;
  pBVar5 = dc_source;
  pDVar4 = dc_destblend;
  pDVar3 = dc_srcblend;
  fVar2 = dc_iscale;
  plVar1 = dc_colormap;
  if (0 < dc_count) {
    lVar10 = (long)dc_pitch;
    pbVar8 = dc_dest;
    iVar7 = dc_count;
    fVar9 = dc_texturefrac;
    do {
      uVar11 = pDVar4[*pbVar8] + pDVar3[plVar1[pBVar6[pBVar5[fVar9 >> 0x10]]]] & 0x40100400;
      uVar11 = uVar11 - (uVar11 >> 5) |
               pDVar4[*pbVar8] + pDVar3[plVar1[pBVar6[pBVar5[fVar9 >> 0x10]]]] & 0x3e0f83e0 |
               0x1f07c1f;
      *pbVar8 = RGB32k.All[uVar11 >> 0xf & uVar11];
      pbVar8 = pbVar8 + lVar10;
      fVar9 = fVar9 + fVar2;
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
  }
  return;
}

Assistant:

void R_DrawAddClampTranslatedColumnP_C ()
{
	int count;
	BYTE *dest;
	fixed_t frac;
	fixed_t fracstep;

	count = dc_count;
	if (count <= 0)
		return;

	dest = dc_dest;

	fracstep = dc_iscale;
	frac = dc_texturefrac;

	{
		BYTE *translation = dc_translation;
		BYTE *colormap = dc_colormap;
		const BYTE *source = dc_source;
		int pitch = dc_pitch;
		DWORD *fg2rgb = dc_srcblend;
		DWORD *bg2rgb = dc_destblend;

		do
		{
			DWORD a = fg2rgb[colormap[translation[source[frac>>FRACBITS]]]] + bg2rgb[*dest];
			DWORD b = a;

			a |= 0x01f07c1f;
			b &= 0x40100400;
			a &= 0x3fffffff;
			b = b - (b >> 5);
			a |= b;
			*dest = RGB32k.All[(a>>15) & a];
			dest += pitch;
			frac += fracstep;
		} while (--count);
	}
}